

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::_makeunreachable(TranslateToFuzzReader *this)

{
  WeightedOption weightedOption;
  FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *this_00;
  FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *this_01;
  Expression *pEVar1;
  long *plVar2;
  long extraout_RDX;
  code *local_148;
  Type local_110;
  code *local_108;
  undefined8 local_100;
  FeatureSet local_f4;
  code *local_f0;
  undefined8 local_e8;
  code *local_e0;
  undefined8 local_d8;
  FeatureSet local_cc;
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 uStack_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  FeatureSet local_4c;
  undefined1 auStack_48 [8];
  FeatureOptions<Expression_*(Self::*)(Type)> options;
  TranslateToFuzzReader *this_local;
  
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  auStack_48 = (undefined1  [8])0x0;
  options.options._M_t._M_impl._0_8_ = 0;
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
  FeatureOptions((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 auStack_48);
  FeatureSet::FeatureSet(&local_4c,0);
  local_78 = makeBreak;
  uStack_70 = 0;
  local_68 = 2;
  local_88 = makeUnreachable;
  local_80 = 0;
  local_98 = makeCall;
  local_90 = 0;
  local_a8 = makeCallIndirect;
  uStack_a0 = 0;
  local_b8 = makeSwitch;
  uStack_b0 = 0;
  local_c8 = makeReturn;
  uStack_c0 = 0;
  weightedOption.weight = 2;
  weightedOption._0_16_ = ZEXT816(0x20ee20);
  this_00 = (FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
            Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
            add<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                      ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                        *)auStack_48,local_4c,weightedOption,0x216d10,0,0x20f2f0,0,0x20f680);
  FeatureSet::FeatureSet(&local_cc,0x40);
  local_e0 = makeThrow;
  local_d8 = 0;
  local_f0 = makeThrowRef;
  local_e8 = 0;
  this_01 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
            add<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                      (this_00,local_cc,0x217180,0);
  FeatureSet::FeatureSet(&local_f4,0x500);
  local_108 = makeCallRef;
  local_100 = 0;
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
            (this_01,local_f4,0x210870);
  local_148 = (code *)_wasm__TranslateToFuzzReader___constwasm__TranslateToFuzzReader__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
                                (this,(FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                                       *)auStack_48);
  plVar2 = (long *)((long)&this->wasm + extraout_RDX);
  if (((ulong)local_148 & 1) != 0) {
    local_148 = *(code **)(local_148 + *plVar2 + -1);
  }
  Type::Type(&local_110,unreachable);
  pEVar1 = (Expression *)(*local_148)(plVar2,local_110.id);
  Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
  ~FeatureOptions((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                  auStack_48);
  return pEVar1;
}

Assistant:

Expression* TranslateToFuzzReader::_makeunreachable() {
  using Self = TranslateToFuzzReader;
  auto options = FeatureOptions<Expression* (Self::*)(Type)>();
  using WeightedOption = decltype(options)::WeightedOption;
  // Many instructions can become unreachable if a child is unreachable. We
  // create such code in mutate() (see |allowUnreachable| there). The list of
  // instructions here are those that necessarily have unreachable type, and are
  // only created here (though they might have other variations that are
  // reachable, like br has br_if that is created elsewhere, and we have call
  // here because of return calls, etc.).
  options
    .add(FeatureSet::MVP,
         WeightedOption{&Self::makeBreak, Important},
         &Self::makeUnreachable,
         &Self::makeCall,
         &Self::makeCallIndirect,
         &Self::makeSwitch,
         &Self::makeReturn)
    .add(FeatureSet::ExceptionHandling, &Self::makeThrow, &Self::makeThrowRef)
    .add(FeatureSet::ReferenceTypes | FeatureSet::GC, &Self::makeCallRef);
  return (this->*pick(options))(Type::unreachable);
}